

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
wasm::WATParser::results<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
           *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  Type *pTVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_d0;
  Err *local_b0;
  Err *err;
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  undefined1 local_38 [8];
  ResultsT res;
  bool hasAny;
  ParseDefsCtx *ctx_local;
  
  res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  TypeParserCtx<wasm::WATParser::ParseDefsCtx>::makeResults
            ((ResultsT *)local_38,&ctx->super_TypeParserCtx<wasm::WATParser::ParseDefsCtx>);
  while( true ) {
    expected = sv("result",6);
    bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
    if (!bVar1) break;
    res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    while (bVar1 = Lexer::takeRParen(&ctx->in), ((bVar1 ^ 0xffU) & 1) != 0) {
      valtype<wasm::WATParser::ParseDefsCtx>
                ((Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx);
      Result<wasm::Type>::Result
                ((Result<wasm::Type> *)&err,
                 (Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      local_b0 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err);
      bVar1 = local_b0 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_d0,local_b0);
        MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::MaybeResult
                  (__return_storage_ptr__,&local_d0);
        wasm::Err::~Err(&local_d0);
      }
      Result<wasm::Type>::~Result((Result<wasm::Type> *)&err);
      if (!bVar1) {
        pTVar2 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        TypeParserCtx<wasm::WATParser::ParseDefsCtx>::appendResult
                  (&ctx->super_TypeParserCtx<wasm::WATParser::ParseDefsCtx>,(ResultsT *)local_38,
                   (TypeT)pTVar2->id);
      }
      Result<wasm::Type>::~Result
                ((Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      if (bVar1 && bVar1) goto LAB_024d733b;
    }
  }
  if ((res.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::MaybeResult
              (__return_storage_ptr__);
  }
  else {
    MaybeResult<std::vector<wasm::Type,std::allocator<wasm::Type>>>::
    MaybeResult<std::vector<wasm::Type,std::allocator<wasm::Type>>>
              ((MaybeResult<std::vector<wasm::Type,std::allocator<wasm::Type>>> *)
               __return_storage_ptr__,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  }
LAB_024d733b:
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}